

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_ext(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg;
  TCGTemp *a2;
  ushort uVar1;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 ret;
  
  s_00 = s->uc->tcg_ctx;
  arg = s_00->cpu_dregs[insn & 7];
  uVar1 = insn >> 6 & 7;
  a2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a2 - (long)s_00);
  if (uVar1 == 3) {
    tcg_gen_ext16s_i32_m68k(s_00,ret,arg);
  }
  else {
    tcg_gen_ext8s_i32_m68k(s_00,ret,arg);
    if (uVar1 == 2) {
      gen_partset_reg(s_00,1,arg,ret);
      goto LAB_006f8102;
    }
  }
  if (arg != ret) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(arg + (long)s_00),(TCGArg)a2);
  }
LAB_006f8102:
  gen_logic_cc(s,ret,2);
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

DISAS_INSN(ext)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int op;
    TCGv reg;
    TCGv tmp;

    reg = DREG(insn, 0);
    op = (insn >> 6) & 7;
    tmp = tcg_temp_new(tcg_ctx);
    if (op == 3)
        tcg_gen_ext16s_i32(tcg_ctx, tmp, reg);
    else
        tcg_gen_ext8s_i32(tcg_ctx, tmp, reg);
    if (op == 2)
        gen_partset_reg(tcg_ctx, OS_WORD, reg, tmp);
    else
        tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    gen_logic_cc(s, tmp, OS_LONG);
    tcg_temp_free(tcg_ctx, tmp);
}